

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O3

void duckdb::RadixSort(BufferManager *buffer_manager,data_ptr_t *dataptr,idx_t *count,
                      idx_t *col_offset,idx_t *sorting_size,SortLayout *sort_layout,
                      bool contains_string)

{
  data_ptr_t pdVar1;
  int iVar2;
  unsigned_long uVar3;
  ulong uVar4;
  undefined4 extraout_var;
  idx_t *piVar6;
  long lVar7;
  PDQIterator local_a0;
  PDQIterator result;
  BufferHandle temp_block;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> local_68;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> local_58;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> local_48;
  ulong uVar5;
  
  if (contains_string) {
    pdVar1 = *dataptr;
    piVar6 = &sort_layout->entry_size;
    duckdb_pdqsort::PDQConstants::PDQConstants
              ((PDQConstants *)&temp_block,sort_layout->entry_size,*col_offset,*sorting_size,
               pdVar1 + *count * sort_layout->entry_size);
    lVar7 = sort_layout->entry_size * *count;
    result.ptr = pdVar1 + lVar7;
    result.entry_size = piVar6;
    if (lVar7 != 0) {
      local_a0.ptr = pdVar1;
      local_a0.entry_size = piVar6;
      uVar3 = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar7);
      uVar4 = uVar3 / *piVar6;
      lVar7 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      iVar2 = (int)lVar7;
      if (uVar4 < 2) {
        iVar2 = 0;
      }
      duckdb_pdqsort::pdqsort_loop<true>(&local_a0,&result,(PDQConstants *)&temp_block,iVar2,true);
    }
    if (local_48.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0) {
      operator_delete__((void *)local_48.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
    if (local_58.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0) {
      operator_delete__((void *)local_58.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
    if (local_68.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
        (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0) {
      operator_delete__((void *)local_68.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    }
  }
  else if (*count < 0x19) {
    temp_block.handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    InsertionSort(*dataptr,(data_ptr_t)0x0,count,col_offset,&sort_layout->entry_size,sorting_size,
                  (idx_t *)&temp_block,false);
  }
  else {
    if (*sorting_size < 5) {
      RadixSortLSD(buffer_manager,dataptr,count,col_offset,&sort_layout->entry_size,sorting_size);
      return;
    }
    iVar2 = (*buffer_manager->_vptr_BufferManager[0xf])(buffer_manager);
    uVar5 = CONCAT44(extraout_var,iVar2);
    uVar4 = sort_layout->entry_size * *count;
    if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
      uVar4 = uVar5;
    }
    (*buffer_manager->_vptr_BufferManager[4])(&temp_block,buffer_manager,4,uVar4,1);
    piVar6 = (idx_t *)operator_new__(-(ulong)(*sorting_size * 0x101 >> 0x3d != 0) |
                                     *sorting_size * 0x808);
    pdVar1 = *dataptr;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&temp_block.node);
    local_a0.ptr = (data_ptr_t)0x0;
    RadixSortMSD(pdVar1,(temp_block.node.ptr)->buffer,count,col_offset,&sort_layout->entry_size,
                 sorting_size,(idx_t *)&local_a0,piVar6,false);
    operator_delete__(piVar6);
    BufferHandle::~BufferHandle(&temp_block);
  }
  return;
}

Assistant:

void RadixSort(BufferManager &buffer_manager, const data_ptr_t &dataptr, const idx_t &count, const idx_t &col_offset,
               const idx_t &sorting_size, const SortLayout &sort_layout, bool contains_string) {

	if (contains_string) {
		auto begin = duckdb_pdqsort::PDQIterator(dataptr, sort_layout.entry_size);
		auto end = begin + count;
		duckdb_pdqsort::PDQConstants constants(sort_layout.entry_size, col_offset, sorting_size, *end);
		return duckdb_pdqsort::pdqsort_branchless(begin, begin + count, constants);
	}

	if (count <= SortConstants::INSERTION_SORT_THRESHOLD) {
		return InsertionSort(dataptr, nullptr, count, col_offset, sort_layout.entry_size, sorting_size, 0, false);
	}

	if (sorting_size <= SortConstants::MSD_RADIX_SORT_SIZE_THRESHOLD) {
		return RadixSortLSD(buffer_manager, dataptr, count, col_offset, sort_layout.entry_size, sorting_size);
	}

	const auto block_size = buffer_manager.GetBlockSize();
	auto temp_block =
	    buffer_manager.Allocate(MemoryTag::ORDER_BY, MaxValue(count * sort_layout.entry_size, block_size));
	auto pre_allocated_array =
	    make_unsafe_uniq_array_uninitialized<idx_t>(sorting_size * SortConstants::MSD_RADIX_LOCATIONS);
	RadixSortMSD(dataptr, temp_block.Ptr(), count, col_offset, sort_layout.entry_size, sorting_size, 0,
	             pre_allocated_array.get(), false);
}